

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_STM_t32(DisasContext_conflict1 *s,arg_ldst_block *a)

{
  arg_ldst_block *a_local;
  DisasContext_conflict1 *s_local;
  
  if ((a->w == 0) || ((a->list & 1 << ((byte)a->rn & 0x1f)) == 0)) {
    s_local._7_1_ = op_stm(s,a,2);
  }
  else {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_STM_t32(DisasContext *s, arg_ldst_block *a)
{
    /* Writeback register in register list is UNPREDICTABLE for T32.  */
    if (a->w && (a->list & (1 << a->rn))) {
        unallocated_encoding(s);
        return true;
    }
    /* BitCount(list) < 2 is UNPREDICTABLE */
    return op_stm(s, a, 2);
}